

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# painter.cpp
# Opt level: O2

void __thiscall cppurses::Painter::put(Painter *this,Glyph *tile,size_t x,size_t y)

{
  size_t sVar1;
  size_t sVar2;
  
  if ((x < (this->inner_area_).width) && (y < (this->inner_area_).height)) {
    sVar1 = Widget::inner_x(this->widget_);
    sVar2 = Widget::inner_y(this->widget_);
    put_global(this,tile,x + sVar1,y + sVar2);
    return;
  }
  return;
}

Assistant:

void Painter::put(const Glyph& tile, std::size_t x, std::size_t y)
{
    if (x >= inner_area_.width || y >= inner_area_.height)
        return;
    const auto x_global = widget_.inner_x() + x;
    const auto y_global = widget_.inner_y() + y;
    this->put_global(tile, x_global, y_global);
}